

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O2

int isobusfs_srv_rx_cg_cm(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  uint8_t uVar1;
  isobusfs_srv_volume *piVar2;
  int iVar3;
  wchar_t wVar4;
  isobusfs_srv_client *client;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t buf_size;
  byte bVar9;
  char *pcVar10;
  isobusfs_srv_priv *priv_00;
  isobusfs_srv_volume *piVar11;
  uint8_t *__src;
  long lVar12;
  undefined8 uStack_1250;
  undefined1 local_123c;
  undefined1 local_123b;
  undefined1 local_1239;
  undefined2 local_1238;
  undefined1 local_1236 [254];
  char isobusfs_volume_path [254];
  char local_1038;
  undefined1 local_1037;
  undefined2 local_1036;
  undefined4 local_1034;
  
  bVar9 = msg->buf[0] & 0xf;
  if (bVar9 == 2) {
    if (priv->server_version < 3) goto LAB_00103a33;
    memset(&local_123c,0,0x104);
    local_123c = 2;
    uVar6 = (ulong)*(ushort *)(msg->buf + 2);
    __src = msg->buf + 4;
    isobusfs_log(4,"< rx volume status request. mode: %x, length: %d, name: %s",msg->buf[1],uVar6,
                 __src);
    client = isobusfs_srv_get_client_by_msg(priv,msg);
    if (client == (isobusfs_srv_client *)0x0) {
      pcVar10 = "can\'t find client";
LAB_00103b4f:
      sVar8 = 0;
      isobusfs_log(2,pcVar10);
      local_1239 = 0x2c;
    }
    else {
      if (uVar6 == 0) {
        __src = (uint8_t *)client->current_dir;
        uVar6 = 0x1000;
      }
      if (((*__src != '\\') || (__src[1] != '\\')) || (__src[2] == '\0')) {
        pcVar10 = "can\'t extract volume name";
        goto LAB_00103b4f;
      }
      sVar8 = 3;
      if (uVar6 < 3) {
        sVar8 = uVar6;
      }
      memcpy(isobusfs_volume_path,__src,sVar8);
      uVar5 = 0;
      while( true ) {
        uVar7 = uVar6;
        if (((uVar6 == uVar5) || (uVar1 = __src[uVar5], uVar7 = uVar5, uVar1 == '\0')) ||
           (uVar1 == '\\')) goto LAB_00103c1e;
        if (uVar5 == 0xfd) break;
        isobusfs_volume_path[uVar5] = uVar1;
        uVar5 = uVar5 + 1;
      }
      uVar7 = 0xfd;
LAB_00103c1e:
      isobusfs_volume_path[uVar7] = '\0';
      sVar8 = strlen(isobusfs_volume_path);
      local_1238 = (undefined2)sVar8;
      memcpy(local_1236,isobusfs_volume_path,sVar8 + 1);
      wVar4 = isobusfs_path_to_linux_path
                        ((isobusfs_srv_priv_conflict *)priv,isobusfs_volume_path,0xfe,&local_1038,
                         0x1000);
      if (wVar4 < L'\0') {
        isobusfs_log(2,"can\'t convert %s path to linux path",isobusfs_volume_path);
        local_1239 = 4;
      }
      else {
        uVar6 = 0;
        iVar3 = isobusfs_cmn_dh_validate_dir_path(&local_1038,0);
        local_1239 = 2;
        if (-1 < iVar3) {
          if (0 < priv->volume_count) {
            uVar6 = (ulong)(uint)priv->volume_count;
          }
          lVar12 = uVar6 + 1;
          piVar2 = (isobusfs_srv_volume *)(priv->clients[0xec].current_dir + 0x9bd);
          do {
            piVar11 = piVar2;
            lVar12 = lVar12 + -1;
            if (lVar12 == 0) {
              local_1239 = 4;
              goto LAB_00103b5f;
            }
            priv_00 = (isobusfs_srv_priv *)piVar11[1].name;
            iVar3 = strncmp((char *)priv_00,isobusfs_volume_path,0xfe);
            piVar2 = piVar11 + 1;
          } while (iVar3 != 0);
          local_1239 = 2;
          if ((msg->buf[1] & 2) == 0) {
            if (((msg->buf[1] & 1) == 0) ||
               (iVar3 = isobusfs_srv_request_volume(priv_00,client,piVar11 + 1), -1 < iVar3)) {
LAB_00103d36:
              local_123b = 0 < piVar11[1].refcount;
              local_1239 = 0;
            }
          }
          else if (piVar11[1].removable != false) goto LAB_00103d36;
        }
      }
    }
LAB_00103b5f:
    uVar6 = sVar8 & 0xffff;
    buf_size = uVar6 + 6;
    if ((ushort)sVar8 < 2) {
      memset(local_1236 + uVar6,0xff,2 - uVar6);
      buf_size = 8;
    }
    else if (0xfffa < (ushort)sVar8) {
      isobusfs_log(2,"volume status response too long");
      local_1239 = 0x2b;
      buf_size = 0x10000;
    }
    iVar3 = isobusfs_srv_sendto(priv,msg,&local_123c,buf_size);
    if (-1 < iVar3) {
      isobusfs_log(4,
                   "> tx volume status response. status: %d, error code: %d, name len: %d, name: %s"
                   ,local_123b,local_1239,local_1238);
      return 0;
    }
    pcVar10 = "can\'t send volume status response";
  }
  else {
    if (bVar9 != 1) {
      if ((msg->buf[0] & 0xf) == 0) {
        isobusfs_log(4,"< rx ccm version: %d",msg->buf[1]);
        return 0;
      }
LAB_00103a33:
      isobusfs_srv_send_error(priv,msg,ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
      isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_cm",bVar9);
      return 0;
    }
    local_1038 = '\x01';
    local_1037 = (undefined1)priv->server_version;
    local_1036 = 0xff;
    local_1034 = 0xffffffff;
    iVar3 = isobusfs_srv_sendto(priv,msg,&local_1038,8);
    if (-1 < iVar3) {
      pcVar10 = "> tx property response";
      iVar3 = 0;
      uStack_1250 = 4;
      goto LAB_00103bf8;
    }
    pcVar10 = "can\'t send property response";
  }
  uStack_1250 = 2;
LAB_00103bf8:
  isobusfs_log(uStack_1250,pcVar10);
  return iVar3;
}

Assistant:

int isobusfs_srv_rx_cg_cm(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	enum isobusfs_cm_cl_to_fs_function func =
		isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	/* Process the received function code and delegate to appropriate
	 * handlers
	 */
	switch (func) {
	case ISOBUSFS_CM_F_CC_MAINTENANCE:
		ret = isobusfs_srv_handle_ccm(priv, msg);
		break;
	case ISOBUSFS_CM_GET_FS_PROPERTIES:
		ret = isobusfs_srv_property_res(priv, msg);
		break;
	case ISOBUSFS_CM_VOLUME_STATUS_REQ:
		if (priv->server_version < 3)
			goto not_supported;

		ret = isobusfs_srv_volume_status_resp(priv, msg);
		break;
	default:
		goto not_supported;
	}

	return ret;

not_supported:
	/* Handle unsupported functions */
	isobusfs_srv_send_error(priv, msg, ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);

	pr_warn("%s: unsupported function: %i", __func__, func);

	/* Not a critical error */
	return 0;
}